

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall
wabt::WastParser::ParseFuncSignature
          (WastParser *this,FuncSignature *sig,BindingHash *param_bindings)

{
  Result RVar1;
  Enum EVar2;
  ResolveTypes result_references;
  ResolveTypes param_references;
  value_type local_68;
  value_type local_48;
  
  local_48.vars.
  super__Vector_base<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.vars.
  super__Vector_base<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.vars.
  super__Vector_base<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.vars.
  super__Vector_base<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.vars.
  super__Vector_base<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.vars.
  super__Vector_base<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.target_types = &sig->result_types;
  local_48.target_types = &sig->param_types;
  RVar1 = ParseBoundValueTypeList(this,Param,&sig->param_types,param_bindings,&local_48.vars,0);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    RVar1 = ParseUnboundValueTypeList(this,Result,&sig->result_types,&local_68.vars);
    if (RVar1.enum_ != Error) {
      if (local_48.vars.
          super__Vector_base<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_48.vars.
          super__Vector_base<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::vector<wabt::WastParser::ResolveTypes,_std::allocator<wabt::WastParser::ResolveTypes>_>
        ::push_back(&this->resolve_types_,&local_48);
      }
      EVar2 = Ok;
      if (local_68.vars.
          super__Vector_base<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_68.vars.
          super__Vector_base<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::vector<wabt::WastParser::ResolveTypes,_std::allocator<wabt::WastParser::ResolveTypes>_>
        ::push_back(&this->resolve_types_,&local_68);
        EVar2 = Ok;
      }
    }
  }
  std::vector<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>::
  ~vector(&local_68.vars);
  std::vector<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>::
  ~vector(&local_48.vars);
  return (Result)EVar2;
}

Assistant:

Result WastParser::ParseFuncSignature(FuncSignature* sig,
                                      BindingHash* param_bindings) {
  WABT_TRACE(ParseFuncSignature);

  ResolveTypes param_references(&sig->param_types);
  ResolveTypes result_references(&sig->result_types);

  CHECK_RESULT(ParseBoundValueTypeList(TokenType::Param, &sig->param_types,
                                       param_bindings, &param_references.vars));
  CHECK_RESULT(ParseResultList(&sig->result_types, &result_references.vars));

  if (!param_references.vars.empty()) {
    resolve_types_.push_back(param_references);
  }

  if (!result_references.vars.empty()) {
    resolve_types_.push_back(result_references);
  }

  return Result::Ok;
}